

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void opengv::absolute_pose::modules::gp3p_main
               (Matrix3d *f,Matrix3d *v,Matrix3d *p,transformations_t *solutions)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  iterator __position;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  long lVar11;
  double *pdVar12;
  long lVar13;
  undefined1 *puVar14;
  double dVar15;
  Packet2d mask;
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  transformation_t transformation;
  Vector3d n;
  cayley_t cayley;
  Matrix<std::complex<double>,_8,_1,_0,_8,_1> D;
  Matrix<std::complex<double>,_8,_8,_0,_8,_8> V;
  Matrix<double,_8,_8,_0,_8,_8> M;
  EigenSolver<Eigen::Matrix<double,_8,_8,_0,_8,_8>_> Eig;
  Matrix<double,_48,_85,_0,_48,_85> groebnerMatrix;
  undefined1 *local_93e0;
  long local_93d8;
  double local_93d0 [4];
  undefined8 uStack_93b0;
  double local_93a8;
  double local_93a0;
  double dStack_9398;
  double local_9390;
  Matrix3d *local_9380;
  vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
  *local_9378;
  double *local_9370 [2];
  undefined1 local_9360 [16];
  double dStack_9350;
  double dStack_9348;
  double dStack_9340;
  double dStack_9338;
  double dStack_9330;
  double dStack_9328;
  double dStack_9320;
  undefined1 local_9318 [16];
  double local_9308;
  double adStack_92f8 [4];
  cayley_t local_92d8;
  undefined8 local_92c0;
  double adStack_92b8 [15];
  EigenvectorsType local_9240;
  ulong local_8e40;
  ulong uStack_8e38;
  ulong uStack_8e30;
  ulong uStack_8e28;
  ulong uStack_8e20;
  ulong uStack_8e18;
  undefined8 uStack_8e10;
  undefined8 uStack_8e08;
  ulong local_8e00;
  ulong uStack_8df8;
  ulong uStack_8df0;
  ulong uStack_8de8;
  ulong uStack_8de0;
  ulong uStack_8dd8;
  undefined8 uStack_8dd0;
  undefined8 uStack_8dc8;
  ulong local_8dc0;
  ulong uStack_8db8;
  ulong uStack_8db0;
  ulong uStack_8da8;
  ulong uStack_8da0;
  ulong uStack_8d98;
  undefined8 uStack_8d90;
  undefined8 uStack_8d88;
  ulong local_8d80;
  ulong uStack_8d78;
  ulong uStack_8d70;
  ulong uStack_8d68;
  ulong uStack_8d60;
  ulong uStack_8d58;
  undefined8 uStack_8d50;
  undefined8 uStack_8d48;
  ulong local_8d40;
  ulong uStack_8d38;
  ulong uStack_8d30;
  ulong uStack_8d28;
  ulong uStack_8d20;
  ulong uStack_8d18;
  undefined8 uStack_8d10;
  undefined8 uStack_8d08;
  ulong local_8d00;
  ulong uStack_8cf8;
  ulong uStack_8cf0;
  ulong uStack_8ce8;
  ulong uStack_8ce0;
  ulong uStack_8cd8;
  undefined8 uStack_8cd0;
  undefined8 uStack_8cc8;
  ulong local_8cc0;
  ulong uStack_8cb8;
  ulong uStack_8cb0;
  ulong uStack_8ca8;
  ulong uStack_8ca0;
  ulong uStack_8c98;
  undefined8 uStack_8c90;
  undefined8 uStack_8c88;
  ulong local_8c80;
  ulong uStack_8c78;
  ulong uStack_8c70;
  ulong uStack_8c68;
  ulong uStack_8c60;
  ulong uStack_8c58;
  undefined8 uStack_8c50;
  undefined8 uStack_8c48;
  undefined1 local_8c40 [520];
  double dStack_8a38;
  undefined8 uStack_8a30;
  undefined8 uStack_8a28;
  undefined8 uStack_8a20;
  undefined8 uStack_8a18;
  undefined8 uStack_8a10;
  undefined8 uStack_8a08;
  undefined8 local_8a00;
  undefined8 uStack_89f8;
  undefined8 uStack_89f0;
  undefined8 uStack_89e8;
  undefined8 uStack_89e0;
  undefined8 uStack_89d8;
  undefined8 uStack_89d0;
  undefined8 uStack_89c8;
  undefined2 local_89c0;
  bool local_82c0;
  undefined2 local_827c;
  Index local_8278;
  EVP_PKEY_CTX local_8000 [29856];
  ulong local_b60;
  ulong uStack_b58;
  ulong local_b50;
  ulong uStack_b48;
  ulong local_b40;
  ulong uStack_b38;
  ulong local_9e0;
  ulong uStack_9d8;
  ulong local_9d0;
  ulong uStack_9c8;
  ulong local_9c0;
  ulong uStack_9b8;
  ulong local_860;
  ulong uStack_858;
  ulong local_850;
  ulong uStack_848;
  ulong local_840;
  ulong uStack_838;
  ulong local_6e0;
  ulong uStack_6d8;
  ulong local_6d0;
  ulong uStack_6c8;
  ulong local_6c0;
  ulong uStack_6b8;
  ulong local_560;
  ulong uStack_558;
  ulong local_550;
  ulong uStack_548;
  ulong local_540;
  ulong uStack_538;
  ulong local_3e0;
  ulong uStack_3d8;
  ulong local_3d0;
  ulong uStack_3c8;
  ulong local_3c0;
  ulong uStack_3b8;
  ulong local_260;
  ulong uStack_258;
  ulong local_250;
  ulong uStack_248;
  ulong local_240;
  ulong uStack_238;
  ulong local_e0;
  ulong uStack_d8;
  ulong local_d0;
  ulong uStack_c8;
  ulong local_c0;
  ulong uStack_b8;
  
  memset(local_8000,0,0x7f80);
  gp3p::init(local_8000);
  gp3p::compute((Matrix<double,_48,_85,_0,_48,_85> *)local_8000);
  uStack_8e08 = 0;
  uStack_8dd0 = 0;
  uStack_8dc8 = 0;
  uStack_8c50 = 0;
  uStack_8c48 = 0;
  uStack_8c90 = 0;
  uStack_8cd0 = 0;
  uStack_8cc8 = 0;
  uStack_8d10 = 0;
  uStack_8d08 = 0;
  uStack_8d50 = 0;
  uStack_8d48 = 0;
  uStack_8d90 = 0;
  uStack_8d88 = 0;
  local_8e40 = local_b60 ^ 0x8000000000000000;
  uStack_8e38 = uStack_b58 ^ 0x8000000000000000;
  uStack_8e30 = local_b50 ^ 0x8000000000000000;
  uStack_8e28 = uStack_b48 ^ 0x8000000000000000;
  uStack_8e20 = local_b40 ^ 0x8000000000000000;
  uStack_8e18 = uStack_b38 ^ 0x8000000000000000;
  local_8e00 = local_9e0 ^ 0x8000000000000000;
  uStack_8df8 = uStack_9d8 ^ 0x8000000000000000;
  uStack_8df0 = local_9d0 ^ 0x8000000000000000;
  uStack_8de8 = uStack_9c8 ^ 0x8000000000000000;
  uStack_8de0 = local_9c0 ^ 0x8000000000000000;
  uStack_8dd8 = uStack_9b8 ^ 0x8000000000000000;
  local_8dc0 = local_860 ^ 0x8000000000000000;
  uStack_8db8 = uStack_858 ^ 0x8000000000000000;
  uStack_8db0 = local_850 ^ 0x8000000000000000;
  uStack_8da8 = uStack_848 ^ 0x8000000000000000;
  uStack_8da0 = local_840 ^ 0x8000000000000000;
  uStack_8d98 = uStack_838 ^ 0x8000000000000000;
  local_8d80 = local_6e0 ^ 0x8000000000000000;
  uStack_8d78 = uStack_6d8 ^ 0x8000000000000000;
  uStack_8d70 = local_6d0 ^ 0x8000000000000000;
  uStack_8d68 = uStack_6c8 ^ 0x8000000000000000;
  uStack_8d60 = local_6c0 ^ 0x8000000000000000;
  uStack_8d58 = uStack_6b8 ^ 0x8000000000000000;
  local_8d40 = local_560 ^ 0x8000000000000000;
  uStack_8d38 = uStack_558 ^ 0x8000000000000000;
  uStack_8d30 = local_550 ^ 0x8000000000000000;
  uStack_8d28 = uStack_548 ^ 0x8000000000000000;
  uStack_8d20 = local_540 ^ 0x8000000000000000;
  uStack_8d18 = uStack_538 ^ 0x8000000000000000;
  local_8d00 = local_3e0 ^ 0x8000000000000000;
  uStack_8cf8 = uStack_3d8 ^ 0x8000000000000000;
  uStack_8cf0 = local_3d0 ^ 0x8000000000000000;
  uStack_8ce8 = uStack_3c8 ^ 0x8000000000000000;
  uStack_8ce0 = local_3c0 ^ 0x8000000000000000;
  uStack_8cd8 = uStack_3b8 ^ 0x8000000000000000;
  local_8cc0 = local_260 ^ 0x8000000000000000;
  uStack_8cb8 = uStack_258 ^ 0x8000000000000000;
  uStack_8cb0 = local_250 ^ 0x8000000000000000;
  uStack_8ca8 = uStack_248 ^ 0x8000000000000000;
  uStack_8ca0 = local_240 ^ 0x8000000000000000;
  uStack_8c98 = uStack_238 ^ 0x8000000000000000;
  local_8c80 = local_e0 ^ 0x8000000000000000;
  uStack_8c78 = uStack_d8 ^ 0x8000000000000000;
  uStack_8c70 = local_d0 ^ 0x8000000000000000;
  uStack_8c68 = uStack_c8 ^ 0x8000000000000000;
  uStack_8c60 = local_c0 ^ 0x8000000000000000;
  uStack_8c58 = uStack_b8 ^ 0x8000000000000000;
  uStack_8e10 = 0x3ff0000000000000;
  uStack_8c88 = 0x3ff0000000000000;
  local_82c0 = false;
  local_827c._0_1_ = false;
  local_827c._1_1_ = false;
  local_8c40._512_8_ = 0;
  dStack_8a38 = 0.0;
  uStack_8a30 = 0;
  uStack_8a28 = 0;
  uStack_8a20 = 0;
  uStack_8a18 = 0;
  uStack_8a10 = 0;
  uStack_8a08 = 0;
  local_8a00 = 0;
  uStack_89f8 = 0;
  uStack_89f0 = 0;
  uStack_89e8 = 0;
  uStack_89e0 = 0;
  uStack_89d8 = 0;
  uStack_89d0 = 0;
  uStack_89c8 = 0;
  local_89c0._0_1_ = false;
  local_89c0._1_1_ = false;
  local_8278 = -1;
  Eigen::EigenSolver<Eigen::Matrix<double,8,8,0,8,8>>::compute<Eigen::Matrix<double,8,8,0,8,8>>
            ((EigenSolver<Eigen::Matrix<double,8,8,0,8,8>> *)local_8c40,
             (EigenBase<Eigen::Matrix<double,_8,_8,_0,_8,_8>_> *)&local_8e40,true);
  adStack_92b8[7] = (double)local_8a00;
  adStack_92b8[8] = (double)uStack_89f8;
  adStack_92b8[9] = (double)uStack_89f0;
  adStack_92b8[10] = (double)uStack_89e8;
  adStack_92b8[0xb] = (double)uStack_89e0;
  adStack_92b8[0xc] = (double)uStack_89d8;
  adStack_92b8[0xd] = (double)uStack_89d0;
  adStack_92b8[0xe] = (double)uStack_89c8;
  local_92c0 = local_8c40._512_8_;
  adStack_92b8[0] = dStack_8a38;
  adStack_92b8[1] = (double)uStack_8a30;
  adStack_92b8[2] = (double)uStack_8a28;
  adStack_92b8[3] = (double)uStack_8a20;
  adStack_92b8[4] = (double)uStack_8a18;
  adStack_92b8[5] = (double)uStack_8a10;
  adStack_92b8[6] = (double)uStack_8a08;
  Eigen::EigenSolver<Eigen::Matrix<double,_8,_8,_0,_8,_8>_>::eigenvectors
            (&local_9240,(EigenSolver<Eigen::Matrix<double,_8,_8,_0,_8,_8>_> *)local_8c40);
  lVar11 = 0;
  local_93e0 = (undefined1 *)
               ((long)(local_9240.
                       super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_8,_0,_8,_8>_>.
                       m_storage.m_data.array + 4) + 8);
  local_9370[0] = (double *)0x4008000000000000;
  local_9370[1] = (double *)0x4008000000000000;
  local_9378 = (vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
                *)solutions;
  local_9380 = p;
  do {
    local_93d8 = lVar11;
    if (adStack_92b8[lVar11 * 2] < 0.0001) {
      lVar13 = 3;
      puVar14 = local_93e0;
      do {
        dVar15 = (double)__divdc3();
        local_92d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[lVar13 + -1] = dVar15;
        dVar15 = (double)__divdc3(*(undefined8 *)(puVar14 + -0x38),*(undefined8 *)(puVar14 + -0x30),
                                  *(undefined8 *)
                                   (local_9240.
                                    super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_8,_0,_8,_8>_>
                                    .m_storage.m_data.array + lVar11 * 8U + 7),
                                  *(undefined8 *)
                                   ((long)(local_9240.
                                           super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_8,_8,_0,_8,_8>_>
                                           .m_storage.m_data.array + lVar11 * 8U + 7) + 8));
        adStack_92f8[lVar13] = dVar15;
        puVar14 = puVar14 + 0x10;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
      math::cayley2rot(&local_92d8);
      dVar10 = dStack_9398;
      dVar9 = local_93a0;
      dVar3 = local_93a8;
      dVar8 = local_93d0[3];
      dVar18 = local_93d0[2];
      dVar15 = local_93d0[1];
      local_93d0[3] = local_93d0[1];
      local_93d0[1] = dVar8;
      auVar5._8_8_ = dStack_9398;
      auVar5._0_8_ = local_93a0;
      local_93a0 = local_93d0[2];
      local_93d0[2] = (double)vmovlpd_avx(auVar5);
      dStack_9398 = local_93a8;
      local_93a8 = dVar10;
      auVar4._8_8_ = uStack_93b0;
      auVar4._0_8_ = dVar15;
      auVar6._8_8_ = dVar3;
      auVar6._0_8_ = dVar18;
      dVar15 = 0.0;
      auVar17 = ZEXT864(0) << 0x40;
      lVar11 = 2;
      pdVar12 = adStack_92f8;
      auVar20 = ZEXT864(0) << 0x40;
      dVar18 = 0.0;
      do {
        pdVar12 = pdVar12 + 1;
        dVar3 = *pdVar12;
        local_9360._0_8_ = local_93d0;
        pdVar1 = (f->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                 array + lVar11 + -2;
        pdVar2 = (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                 array + lVar11 + -2;
        local_9360._8_8_ = dVar3 * *pdVar1 + *pdVar2;
        dStack_9350 = dVar3 * pdVar1[1] + pdVar2[1];
        dVar3 = dVar3 * (f->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                        m_data.array[lVar11] +
                (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
                array[lVar11];
        auVar22._8_8_ = dVar3;
        auVar22._0_8_ = dVar3;
        auVar23._0_8_ = (double)local_9360._8_8_ * local_93d0[0];
        auVar23._8_8_ = (double)local_9360._8_8_ * dVar8;
        auVar5 = vshufpd_avx(register0x00001480,register0x00001480,3);
        auVar5 = vfmadd213pd_fma(auVar5,auVar4,auVar23);
        auVar5 = vfmadd231pd_fma(auVar5,auVar6,auVar22);
        auVar16._0_8_ = auVar5._0_8_ + auVar17._0_8_;
        auVar16._8_8_ = auVar5._8_8_ + auVar17._8_8_;
        auVar17 = ZEXT1664(auVar16);
        auVar21._0_8_ = (double)local_9360._8_8_ * dVar9;
        auVar21._8_8_ = dStack_9350 * dVar10;
        auVar5 = vshufpd_avx(auVar21,auVar21,1);
        dVar15 = auVar21._0_8_ + auVar5._0_8_ + dVar3 * local_9390 + dVar15;
        pdVar1 = (local_9380->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                 m_storage.m_data.array + lVar11 + -2;
        auVar19._0_8_ = auVar20._0_8_ + *pdVar1;
        auVar19._8_8_ = auVar20._8_8_ + pdVar1[1];
        auVar20 = ZEXT1664(auVar19);
        dVar18 = dVar18 + (local_9380->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                          .m_storage.m_data.array[lVar11];
        lVar11 = lVar11 + 3;
      } while (lVar11 != 0xb);
      auVar7._8_8_ = local_9370[1];
      auVar7._0_8_ = local_9370[0];
      auVar4 = vdivpd_avx(auVar16,auVar7);
      auVar5 = vdivpd_avx(auVar19,auVar7);
      auVar4 = vsubpd_avx(auVar5,auVar4);
      lVar11 = 0x10;
      do {
        *(undefined8 *)((long)local_9370 + lVar11) = *(undefined8 *)((long)&local_93e0 + lVar11);
        *(undefined8 *)((long)local_9370 + lVar11 + 8) = *(undefined8 *)((long)&local_93d8 + lVar11)
        ;
        *(undefined8 *)(local_9360 + lVar11) = *(undefined8 *)((long)local_93d0 + lVar11);
        lVar11 = lVar11 + 0x18;
      } while (lVar11 != 0x58);
      local_9308 = dVar18 / 3.0 - dVar15 / 3.0;
      local_9318 = auVar4;
      auVar4 = local_9318;
      __position._M_current = *(Matrix<double,_3,_4,_0,_3,_4> **)(local_9378 + 8);
      if (__position._M_current == *(Matrix<double,_3,_4,_0,_3,_4> **)(local_9378 + 0x10)) {
        std::
        vector<Eigen::Matrix<double,3,4,0,3,4>,Eigen::aligned_allocator<Eigen::Matrix<double,3,4,0,3,4>>>
        ::_M_realloc_insert<Eigen::Matrix<double,3,4,0,3,4>const&>
                  (local_9378,__position,(Matrix<double,_3,_4,_0,_3,_4> *)local_9360);
      }
      else {
        local_9318._0_8_ = auVar4._0_8_;
        local_9318._8_8_ = auVar4._8_8_;
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[4] = dStack_9340;
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[5] = dStack_9338;
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[6] = dStack_9330;
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[7] = dStack_9328;
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[8] = dStack_9320;
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[9] = (double)local_9318._0_8_;
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[10] = (double)local_9318._8_8_;
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[0xb] = local_9308;
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[0] = (double)local_9360._0_8_;
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[1] = (double)local_9360._8_8_;
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[2] = dStack_9350;
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[3] = dStack_9348;
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[4] = dStack_9340;
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[5] = dStack_9338;
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[6] = dStack_9330;
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>).
        m_storage.m_data.array[7] = dStack_9328;
        *(long *)(local_9378 + 8) = *(long *)(local_9378 + 8) + 0x60;
        local_9318 = auVar4;
      }
    }
    lVar11 = local_93d8 + 1;
    local_93e0 = local_93e0 + 0x80;
  } while (lVar11 != 8);
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gp3p_main(
    const Eigen::Matrix3d & f,
    const Eigen::Matrix3d & v,
    const Eigen::Matrix3d & p,
    transformations_t & solutions)
{
  Eigen::Matrix<double,48,85> groebnerMatrix =
      Eigen::Matrix<double,48,85>::Zero();
  gp3p::init(groebnerMatrix,f,v,p);
  gp3p::compute(groebnerMatrix);

  Eigen::Matrix<double,8,8> M = Eigen::Matrix<double,8,8>::Zero();
  M.block<6,8>(0,0) = -groebnerMatrix.block<6,8>(36,77);
  M(6,0) = 1.0;
  M(7,6) = 1.0;

  Eigen::EigenSolver< Eigen::Matrix<double,8,8> > Eig(M,true);
  Eigen::Matrix<std::complex<double>,8,1> D = Eig.eigenvalues();
  Eigen::Matrix<std::complex<double>,8,8> V = Eig.eigenvectors();

  for( int c = 0; c < V.cols(); c++ )
  {
    std::complex<double> eigValue = D[c];

    if( eigValue.imag() < 0.0001 )
    {
      cayley_t cayley;
      Eigen::Vector3d n;

      for(size_t i = 0; i < 3; i++)
      {
        std::complex<double> cay = V(i+4,c)/V(7,c);
        cayley[2-i] = cay.real();
        std::complex<double> depth = V(i+1,c)/V(7,c);
        n[2-i] = depth.real();
      }

      rotation_t rotation = math::cayley2rot(cayley);
      //the groebner problem was set up to find the transpose!
      rotation.transposeInPlace();

      point_t center_cam = Eigen::Vector3d::Zero();
      point_t center_world = Eigen::Vector3d::Zero();
      for( size_t i = 0; i < (size_t) f.cols(); i++ )
      {
        point_t temp = rotation*(n[i]*f.col(i)+v.col(i));
        center_cam = center_cam + temp;
        center_world = center_world + p.col(i);
      }

      center_cam = center_cam/f.cols();
      center_world = center_world/f.cols();
      translation_t translation = center_world - center_cam;

      transformation_t transformation;
      transformation.block<3,3>(0,0) = rotation;
      transformation.col(3) = translation;
      solutions.push_back(transformation);
    }
  }
}